

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Cnf_AddCardinConstrTest(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vVars;
  int *piVar4;
  sat_solver *s;
  long lVar5;
  uint uVar6;
  int iVar7;
  
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 0x10;
  vVars->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  vVars->pArray = piVar4;
  vVars->nSize = 6;
  lVar5 = 0;
  do {
    piVar4[lVar5] = (int)lVar5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  s = sat_solver_new();
  sat_solver_setnvars(s,6);
  Cnf_AddCardinConstr(s,vVars);
  uVar6 = 1;
  do {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar1 != 1) break;
    vVars->nSize = 0;
    iVar7 = 0;
    printf("%3d : ",(ulong)uVar6);
    iVar1 = 0;
    do {
      iVar2 = sat_solver_var_value(s,iVar1);
      Vec_IntPush(vVars,iVar2 + iVar7);
      uVar3 = sat_solver_var_value(s,iVar1);
      printf("%d",(ulong)uVar3);
      iVar1 = iVar1 + 1;
      iVar7 = iVar7 + 2;
    } while (iVar1 != 6);
    uVar6 = uVar6 + 1;
    putchar(10);
    iVar1 = sat_solver_addclause(s,vVars->pArray,vVars->pArray + vVars->nSize);
  } while (iVar1 != 0);
  sat_solver_delete(s);
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
    vVars->pArray = (int *)0x0;
  }
  free(vVars);
  return;
}

Assistant:

void Cnf_AddCardinConstrTest()
{
    int i, status, Count = 1, nVars = 6;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    Cnf_AddCardinConstr( pSat, vVars );
    //Cnf_AddCardinConstrGeneral( pSat, vVars, 1, 1 );
    while ( 1 )
    {
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vVars );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vVars, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vVars), Vec_IntArray(vVars) + Vec_IntSize(vVars) );
        if ( status == 0 )
            break;
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
}